

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O2

void update_sound(void)

{
  ushort uVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = 0.0;
  uVar1 = 0;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    if (freqbits[lVar2] != 0) {
      dVar3 = dVar3 + (4000000.0 / ((double)freqbits[lVar2] * 32.0)) * (double)vol[lVar2];
    }
    uVar1 = uVar1 + vol[lVar2];
  }
  if (uVar1 != 0) {
    sound(dVar3 / (double)uVar1);
    return;
  }
  nosound();
  return;
}

Assistant:

void update_sound(void) {

    uint c, totvol = 0;
    double totfreq = 0;

    for (c = 1; c < 4; c++) {    // step through each channel
        totvol += vol[c];     // keep a running volume count
        if (freqbits[c] == 0) continue;   // check to avoid divide by zero

        totfreq += vol[c] * (4000000. / (32. * freqbits[c]));
    }

    if (totvol == 0) {        // if no channels are turned on, switch off
        nosound();        // all sound
        return;
    }

    totfreq /= totvol;       // normalise sound
    sound(totfreq);        // and generate it
}